

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexst.cpp
# Opt level: O3

void __thiscall icu_63::RegexStaticSets::RegexStaticSets(RegexStaticSets *this,UErrorCode *status)

{
  undefined1 *puVar1;
  Regex8BitSet *pRVar2;
  UBool UVar3;
  UnicodeSet *this_00;
  UnicodeSet *pUVar4;
  UText *pUVar5;
  UnicodeSet *pattern;
  long lVar6;
  int32_t i;
  uint uVar7;
  ulong uVar8;
  bool bVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  UnicodeSet **local_210;
  UnicodeSet local_208;
  UnicodeSet **local_1b0;
  UnicodeSet **local_1a8;
  UnicodeSet **local_1a0;
  ConstChar16Ptr local_198;
  ConstChar16Ptr local_190;
  ConstChar16Ptr local_188;
  ConstChar16Ptr local_180;
  ConstChar16Ptr local_178;
  ConstChar16Ptr local_170;
  ConstChar16Ptr local_168;
  ConstChar16Ptr local_160;
  ConstChar16Ptr local_158;
  ConstChar16Ptr local_150;
  ConstChar16Ptr local_148;
  UnicodeSet *local_140;
  UnicodeSet *local_138;
  UnicodeSet **local_130;
  Regex8BitSet *local_128;
  char16_t *local_120;
  char16_t *local_110;
  char16_t *local_100;
  char16_t *local_f0;
  char16_t *local_e0;
  char16_t *local_d0;
  char16_t *local_c0;
  char16_t *local_b0;
  char16_t *local_a0;
  char16_t *local_90;
  char16_t *local_80;
  UnicodeString local_70;
  
  local_128 = this->fPropSets8;
  lVar6 = 0;
  memset(local_128,0,0x1a0);
  puVar1 = &this->field_0x208;
  pUVar4 = (UnicodeSet *)puVar1;
  do {
    UnicodeSet::UnicodeSet(pUVar4);
    lVar6 = lVar6 + -0x58;
    pUVar4 = pUVar4 + 1;
  } while (lVar6 != -0x370);
  local_148.p_ = (char16_t *)gUnescapeCharPattern;
  icu_63::UnicodeString::UnicodeString((UnicodeString *)&local_208,'\x01',&local_148,-1);
  pUVar4 = &this->fUnescapeCharSet;
  pattern = &local_208;
  UnicodeSet::UnicodeSet(pUVar4,(UnicodeString *)pattern,status);
  icu_63::UnicodeString::~UnicodeString((UnicodeString *)&local_208);
  local_80 = local_148.p_;
  this->fPropSets[10] = (UnicodeSet *)0x0;
  this->fPropSets[0xb] = (UnicodeSet *)0x0;
  this->fPropSets[8] = (UnicodeSet *)0x0;
  this->fPropSets[9] = (UnicodeSet *)0x0;
  this->fPropSets[6] = (UnicodeSet *)0x0;
  this->fPropSets[7] = (UnicodeSet *)0x0;
  this->fPropSets[4] = (UnicodeSet *)0x0;
  this->fPropSets[5] = (UnicodeSet *)0x0;
  this->fPropSets[2] = (UnicodeSet *)0x0;
  this->fPropSets[3] = (UnicodeSet *)0x0;
  this->fPropSets[0] = (UnicodeSet *)0x0;
  this->fPropSets[1] = (UnicodeSet *)0x0;
  this->fPropSets[0xc] = (UnicodeSet *)0x0;
  this->fRuleDigitsAlias = (UnicodeSet *)0x0;
  this->fEmptyText = (UText *)0x0;
  this_00 = (UnicodeSet *)UMemory::operator_new((UMemory *)0x58,(size_t)pattern);
  local_140 = pUVar4;
  if (this_00 == (UnicodeSet *)0x0) {
    this->fPropSets[1] = (UnicodeSet *)0x0;
  }
  else {
    local_150.p_ = (char16_t *)gIsWordPattern;
    icu_63::UnicodeString::UnicodeString((UnicodeString *)&local_208,'\x01',&local_150,-1);
    pattern = &local_208;
    UnicodeSet::UnicodeSet(this_00,(UnicodeString *)pattern,status);
    this->fPropSets[1] = this_00;
    icu_63::UnicodeString::~UnicodeString((UnicodeString *)&local_208);
    local_90 = local_150.p_;
  }
  pUVar4 = (UnicodeSet *)UMemory::operator_new((UMemory *)0x58,(size_t)pattern);
  if (pUVar4 == (UnicodeSet *)0x0) {
    this->fPropSets[4] = (UnicodeSet *)0x0;
  }
  else {
    local_158.p_ = (char16_t *)gIsSpacePattern;
    icu_63::UnicodeString::UnicodeString((UnicodeString *)&local_208,'\x01',&local_158,-1);
    pattern = &local_208;
    UnicodeSet::UnicodeSet(pUVar4,(UnicodeString *)pattern,status);
    this->fPropSets[4] = pUVar4;
    icu_63::UnicodeString::~UnicodeString((UnicodeString *)&local_208);
    local_a0 = local_158.p_;
  }
  local_210 = this->fPropSets + 4;
  pUVar4 = (UnicodeSet *)UMemory::operator_new((UMemory *)0x58,(size_t)pattern);
  if (pUVar4 == (UnicodeSet *)0x0) {
    local_1a0 = this->fPropSets + 6;
    this->fPropSets[6] = (UnicodeSet *)0x0;
  }
  else {
    local_160.p_ = (char16_t *)gGC_ExtendPattern;
    icu_63::UnicodeString::UnicodeString((UnicodeString *)&local_208,'\x01',&local_160,-1);
    pattern = &local_208;
    UnicodeSet::UnicodeSet(pUVar4,(UnicodeString *)pattern,status);
    local_1a0 = this->fPropSets + 6;
    this->fPropSets[6] = pUVar4;
    icu_63::UnicodeString::~UnicodeString((UnicodeString *)&local_208);
    local_b0 = local_160.p_;
  }
  pUVar4 = (UnicodeSet *)UMemory::operator_new((UMemory *)0x58,(size_t)pattern);
  if (pUVar4 == (UnicodeSet *)0x0) {
    local_1a8 = this->fPropSets + 7;
    this->fPropSets[7] = (UnicodeSet *)0x0;
  }
  else {
    local_168.p_ = (char16_t *)gGC_ControlPattern;
    icu_63::UnicodeString::UnicodeString((UnicodeString *)&local_208,'\x01',&local_168,-1);
    pattern = &local_208;
    UnicodeSet::UnicodeSet(pUVar4,(UnicodeString *)pattern,status);
    local_1a8 = this->fPropSets + 7;
    this->fPropSets[7] = pUVar4;
    icu_63::UnicodeString::~UnicodeString((UnicodeString *)&local_208);
    local_c0 = local_168.p_;
  }
  pUVar4 = (UnicodeSet *)UMemory::operator_new((UMemory *)0x58,(size_t)pattern);
  if (pUVar4 == (UnicodeSet *)0x0) {
    local_1b0 = this->fPropSets + 8;
    this->fPropSets[8] = (UnicodeSet *)0x0;
  }
  else {
    local_170.p_ = (char16_t *)gGC_LPattern;
    icu_63::UnicodeString::UnicodeString((UnicodeString *)&local_208,'\x01',&local_170,-1);
    pattern = &local_208;
    UnicodeSet::UnicodeSet(pUVar4,(UnicodeString *)pattern,status);
    local_1b0 = this->fPropSets + 8;
    this->fPropSets[8] = pUVar4;
    icu_63::UnicodeString::~UnicodeString((UnicodeString *)&local_208);
    local_d0 = local_170.p_;
  }
  pUVar4 = (UnicodeSet *)UMemory::operator_new((UMemory *)0x58,(size_t)pattern);
  local_130 = this->fPropSets + 1;
  if (pUVar4 == (UnicodeSet *)0x0) {
    this->fPropSets[0xb] = (UnicodeSet *)0x0;
  }
  else {
    local_178.p_ = (char16_t *)gGC_VPattern;
    icu_63::UnicodeString::UnicodeString((UnicodeString *)&local_208,'\x01',&local_178,-1);
    pattern = &local_208;
    UnicodeSet::UnicodeSet(pUVar4,(UnicodeString *)pattern,status);
    this->fPropSets[0xb] = pUVar4;
    icu_63::UnicodeString::~UnicodeString((UnicodeString *)&local_208);
    local_e0 = local_178.p_;
  }
  pUVar4 = (UnicodeSet *)UMemory::operator_new((UMemory *)0x58,(size_t)pattern);
  if (pUVar4 == (UnicodeSet *)0x0) {
    this->fPropSets[0xc] = (UnicodeSet *)0x0;
  }
  else {
    local_180.p_ = (char16_t *)gGC_TPattern;
    icu_63::UnicodeString::UnicodeString((UnicodeString *)&local_208,'\x01',&local_180,-1);
    pattern = &local_208;
    UnicodeSet::UnicodeSet(pUVar4,(UnicodeString *)pattern,status);
    this->fPropSets[0xc] = pUVar4;
    icu_63::UnicodeString::~UnicodeString((UnicodeString *)&local_208);
    local_f0 = local_180.p_;
  }
  pUVar4 = (UnicodeSet *)UMemory::operator_new((UMemory *)0x58,(size_t)pattern);
  local_138 = (UnicodeSet *)puVar1;
  if (pUVar4 == (UnicodeSet *)0x0) {
    this->fPropSets[9] = (UnicodeSet *)0x0;
  }
  else {
    local_188.p_ = (char16_t *)gGC_LVPattern;
    icu_63::UnicodeString::UnicodeString((UnicodeString *)&local_208,'\x01',&local_188,-1);
    pattern = &local_208;
    UnicodeSet::UnicodeSet(pUVar4,(UnicodeString *)pattern,status);
    this->fPropSets[9] = pUVar4;
    icu_63::UnicodeString::~UnicodeString((UnicodeString *)&local_208);
    local_100 = local_188.p_;
  }
  pUVar4 = (UnicodeSet *)UMemory::operator_new((UMemory *)0x58,(size_t)pattern);
  if (pUVar4 == (UnicodeSet *)0x0) {
    this->fPropSets[10] = (UnicodeSet *)0x0;
    bVar9 = true;
  }
  else {
    local_190.p_ = (char16_t *)gGC_LVTPattern;
    icu_63::UnicodeString::UnicodeString((UnicodeString *)&local_208,'\x01',&local_190,-1);
    pattern = &local_208;
    UnicodeSet::UnicodeSet(pUVar4,(UnicodeString *)pattern,status);
    this->fPropSets[10] = pUVar4;
    icu_63::UnicodeString::~UnicodeString((UnicodeString *)&local_208);
    local_110 = local_190.p_;
    bVar9 = this->fPropSets[10] == (UnicodeSet *)0x0;
  }
  auVar14._0_4_ = -(uint)((int)this->fPropSets[0xc] == 0);
  auVar14._4_4_ = -(uint)((int)((ulong)this->fPropSets[0xc] >> 0x20) == 0);
  auVar14._8_4_ = -(uint)((int)this->fPropSets[9] == 0);
  auVar14._12_4_ = -(uint)((int)((ulong)this->fPropSets[9] >> 0x20) == 0);
  auVar17._4_4_ = auVar14._0_4_;
  auVar17._0_4_ = auVar14._4_4_;
  auVar17._8_4_ = auVar14._12_4_;
  auVar17._12_4_ = auVar14._8_4_;
  auVar16._0_4_ = -(uint)((int)*local_1b0 == 0);
  auVar16._4_4_ = -(uint)((int)((ulong)*local_1b0 >> 0x20) == 0);
  auVar16._8_4_ = -(uint)((int)this->fPropSets[0xb] == 0);
  auVar16._12_4_ = -(uint)((int)((ulong)this->fPropSets[0xb] >> 0x20) == 0);
  auVar15._4_4_ = auVar16._0_4_;
  auVar15._0_4_ = auVar16._4_4_;
  auVar15._8_4_ = auVar16._12_4_;
  auVar15._12_4_ = auVar16._8_4_;
  auVar16 = packssdw(auVar15 & auVar16,auVar17 & auVar14);
  auVar12._0_4_ = -(uint)((int)*local_1a0 == 0);
  auVar12._4_4_ = -(uint)((int)((ulong)*local_1a0 >> 0x20) == 0);
  auVar12._8_4_ = -(uint)((int)*local_1a8 == 0);
  auVar12._12_4_ = -(uint)((int)((ulong)*local_1a8 >> 0x20) == 0);
  auVar13._4_4_ = auVar12._0_4_;
  auVar13._0_4_ = auVar12._4_4_;
  auVar13._8_4_ = auVar12._12_4_;
  auVar13._12_4_ = auVar12._8_4_;
  auVar11._0_4_ = -(uint)((int)*local_130 == 0);
  auVar11._4_4_ = -(uint)((int)((ulong)*local_130 >> 0x20) == 0);
  auVar11._8_4_ = -(uint)((int)*local_210 == 0);
  auVar11._12_4_ = -(uint)((int)((ulong)*local_210 >> 0x20) == 0);
  auVar10._4_4_ = auVar11._0_4_;
  auVar10._0_4_ = auVar11._4_4_;
  auVar10._8_4_ = auVar11._12_4_;
  auVar10._12_4_ = auVar11._8_4_;
  auVar11 = packssdw(auVar10 & auVar11,auVar13 & auVar12);
  auVar11 = packssdw(auVar11,auVar16);
  if (((((((((auVar11 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
            (auVar11 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           (auVar11 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar11 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
         (auVar11 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
        (auVar11 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
       (auVar11 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar11[0xf]) &&
     (!bVar9)) {
    if (U_ZERO_ERROR < *status) {
      return;
    }
    pUVar4 = (UnicodeSet *)UMemory::operator_new((UMemory *)0x58,(size_t)pattern);
    if (pUVar4 == (UnicodeSet *)0x0) {
      this->fPropSets[5] = (UnicodeSet *)0x0;
    }
    else {
      UnicodeSet::UnicodeSet(pUVar4,0,0x10ffff);
      this->fPropSets[5] = pUVar4;
      UnicodeSet::remove(pUVar4,(char *)0xac00);
      UnicodeSet::removeAll(this->fPropSets[5],this->fPropSets[7]);
      UnicodeSet::removeAll(this->fPropSets[5],this->fPropSets[8]);
      UnicodeSet::removeAll(this->fPropSets[5],this->fPropSets[0xb]);
      UnicodeSet::removeAll(this->fPropSets[5],this->fPropSets[0xc]);
      lVar6 = 0;
      do {
        if (this->fPropSets[lVar6] != (UnicodeSet *)0x0) {
          UnicodeSet::compact(this->fPropSets[lVar6]);
          pRVar2 = local_128;
          pUVar4 = this->fPropSets[lVar6];
          if (pUVar4 != (UnicodeSet *)0x0) {
            uVar8 = 0;
            do {
              UVar3 = UnicodeSet::contains(pUVar4,(int)uVar8);
              if (UVar3 != '\0') {
                pRVar2[lVar6].d[uVar8 >> 3] =
                     pRVar2[lVar6].d[uVar8 >> 3] | (byte)(1 << ((byte)uVar8 & 7));
              }
              uVar7 = (int)uVar8 + 1;
              uVar8 = (ulong)uVar7;
            } while (uVar7 != 0x100);
          }
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 != 0xd);
      local_198.p_ = (char16_t *)gRuleSet_rule_char_pattern;
      icu_63::UnicodeString::UnicodeString(&local_70,'\x01',&local_198,-1);
      UnicodeSet::UnicodeSet(&local_208,&local_70,status);
      pUVar4 = local_138;
      UnicodeSet::operator=((UnicodeSet *)&this->field_0x2b8,&local_208);
      UnicodeSet::~UnicodeSet(&local_208);
      icu_63::UnicodeString::~UnicodeString(&local_70);
      local_120 = local_198.p_;
      UnicodeSet::add((UnicodeSet *)&this->field_0x260,0x30,0x39);
      UnicodeSet::add(pUVar4,0x41,0x5a);
      UnicodeSet::add(pUVar4,0x61,0x7a);
      this->fRuleDigitsAlias = (UnicodeSet *)&this->field_0x260;
      lVar6 = 0;
      do {
        UnicodeSet::compact((UnicodeSet *)
                            ((long)&(pUVar4->super_UnicodeFilter).super_UnicodeFunctor.super_UObject
                                    ._vptr_UObject + lVar6));
        lVar6 = lVar6 + 0x58;
      } while (lVar6 != 0x370);
      pattern = (UnicodeSet *)0x0;
      pUVar5 = utext_openUChars_63((UText *)0x0,(UChar *)0x0,0,status);
      this->fEmptyText = pUVar5;
      if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
        return;
      }
    }
  }
  lVar6 = 0;
  do {
    pUVar4 = this->fPropSets[lVar6];
    if (pUVar4 != (UnicodeSet *)0x0) {
      UnicodeSet::~UnicodeSet(pUVar4);
    }
    UMemory::operator_delete((UMemory *)pUVar4,pattern);
    this->fPropSets[lVar6] = (UnicodeSet *)0x0;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0xd);
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    *status = U_MEMORY_ALLOCATION_ERROR;
  }
  return;
}

Assistant:

RegexStaticSets::RegexStaticSets(UErrorCode *status)
:
fUnescapeCharSet(UnicodeString(TRUE, gUnescapeCharPattern, -1), *status),
fRuleDigitsAlias(NULL),
fEmptyText(NULL)
{
    // First zero out everything
    int i;
    for (i=0; i<URX_LAST_SET; i++) {
        fPropSets[i] = NULL;
    }
    // Then init the sets to their correct values.
    fPropSets[URX_ISWORD_SET]  = new UnicodeSet(UnicodeString(TRUE, gIsWordPattern, -1),     *status);
    fPropSets[URX_ISSPACE_SET] = new UnicodeSet(UnicodeString(TRUE, gIsSpacePattern, -1),    *status);
    fPropSets[URX_GC_EXTEND]   = new UnicodeSet(UnicodeString(TRUE, gGC_ExtendPattern, -1),  *status);
    fPropSets[URX_GC_CONTROL]  = new UnicodeSet(UnicodeString(TRUE, gGC_ControlPattern, -1), *status);
    fPropSets[URX_GC_L]        = new UnicodeSet(UnicodeString(TRUE, gGC_LPattern, -1),       *status);
    fPropSets[URX_GC_V]        = new UnicodeSet(UnicodeString(TRUE, gGC_VPattern, -1),       *status);
    fPropSets[URX_GC_T]        = new UnicodeSet(UnicodeString(TRUE, gGC_TPattern, -1),       *status);
    fPropSets[URX_GC_LV]       = new UnicodeSet(UnicodeString(TRUE, gGC_LVPattern, -1),      *status);
    fPropSets[URX_GC_LVT]      = new UnicodeSet(UnicodeString(TRUE, gGC_LVTPattern, -1),     *status);
    
    // Check for null pointers
    if (fPropSets[URX_ISWORD_SET] == NULL || fPropSets[URX_ISSPACE_SET] == NULL || fPropSets[URX_GC_EXTEND] == NULL || 
        fPropSets[URX_GC_CONTROL] == NULL || fPropSets[URX_GC_L] == NULL || fPropSets[URX_GC_V] == NULL || 
        fPropSets[URX_GC_T] == NULL || fPropSets[URX_GC_LV] == NULL || fPropSets[URX_GC_LVT] == NULL) {
        goto ExitConstrDeleteAll;
    }
    if (U_FAILURE(*status)) {
        // Bail out if we were unable to create the above sets.
        // The rest of the initialization needs them, so we cannot proceed.
        return;
    }


    //
    // The following sets  are dynamically constructed, because their
    //   initialization strings would be unreasonable.
    //


    //
    //  "Normal" is the set of characters that don't need special handling
    //            when finding grapheme cluster boundaries.
    //
    fPropSets[URX_GC_NORMAL] = new UnicodeSet(0, UnicodeSet::MAX_VALUE);
    // Null pointer check
    if (fPropSets[URX_GC_NORMAL] == NULL) {
    	goto ExitConstrDeleteAll;
    }
    fPropSets[URX_GC_NORMAL]->remove(0xac00, 0xd7a4);
    fPropSets[URX_GC_NORMAL]->removeAll(*fPropSets[URX_GC_CONTROL]);
    fPropSets[URX_GC_NORMAL]->removeAll(*fPropSets[URX_GC_L]);
    fPropSets[URX_GC_NORMAL]->removeAll(*fPropSets[URX_GC_V]);
    fPropSets[URX_GC_NORMAL]->removeAll(*fPropSets[URX_GC_T]);

    // Initialize the 8-bit fast bit sets from the parallel full
    //   UnicodeSets.
    for (i=0; i<URX_LAST_SET; i++) {
        if (fPropSets[i]) {
            fPropSets[i]->compact();
            fPropSets8[i].init(fPropSets[i]);
        }
    }

    // Sets used while parsing rules, but not referenced from the parse state table
    fRuleSets[kRuleSet_rule_char-128]   = UnicodeSet(UnicodeString(TRUE, gRuleSet_rule_char_pattern, -1),   *status);
    fRuleSets[kRuleSet_digit_char-128].add((UChar)0x30, (UChar)0x39);    // [0-9]
    fRuleSets[kRuleSet_ascii_letter-128].add((UChar)0x41, (UChar)0x5A);  // [A-Z]
    fRuleSets[kRuleSet_ascii_letter-128].add((UChar)0x61, (UChar)0x7A);  // [a-z]
    fRuleDigitsAlias = &fRuleSets[kRuleSet_digit_char-128];
    for (i=0; i<UPRV_LENGTHOF(fRuleSets); i++) {
        fRuleSets[i].compact();
    }
    
    // Finally, initialize an empty string for utility purposes
    fEmptyText = utext_openUChars(NULL, NULL, 0, status);
    
    if (U_SUCCESS(*status)) {
        return;
    }

ExitConstrDeleteAll: // Remove fPropSets and fRuleSets and return error
    for (i=0; i<URX_LAST_SET; i++) {
        delete fPropSets[i];
        fPropSets[i] = NULL;
    }
    if (U_SUCCESS(*status)) {
        *status = U_MEMORY_ALLOCATION_ERROR;
    }
}